

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall HighsSparseMatrix::exactResize(HighsSparseMatrix *this)

{
  pointer piVar1;
  HighsInt *pHVar2;
  size_type __new_size;
  
  pHVar2 = &this->num_row_;
  if (this->format_ == kColwise) {
    pHVar2 = &this->num_col_;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)(*pHVar2 + 1));
  pHVar2 = &this->num_row_;
  if (this->format_ == kColwise) {
    pHVar2 = &this->num_col_;
  }
  __new_size = (size_type)
               (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[*pHVar2];
  if (this->format_ == kRowwisePartitioned) {
    std::vector<int,_std::allocator<int>_>::resize(&this->p_end_,(long)this->num_row_);
  }
  else {
    piVar1 = (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish != piVar1) {
      (this->p_end_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = piVar1;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,__new_size);
  return;
}

Assistant:

void HighsSparseMatrix::exactResize() {
  if (this->isColwise()) {
    this->start_.resize(this->num_col_ + 1);
  } else {
    this->start_.resize(this->num_row_ + 1);
  }
  const HighsInt num_nz = this->isColwise() ? this->start_[this->num_col_]
                                            : this->start_[this->num_row_];
  if (this->format_ == MatrixFormat::kRowwisePartitioned) {
    this->p_end_.resize(this->num_row_);
  } else {
    assert((int)this->p_end_.size() == 0);
    this->p_end_.clear();
  }
  this->index_.resize(num_nz);
  this->value_.resize(num_nz);
}